

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeLast(BtCursor *pCur,int *pRes)

{
  int iVar1;
  
  if ((pCur->eState == '\0') && ((pCur->curFlags & 8) != 0)) {
    *pRes = 0;
    return 0;
  }
  iVar1 = moveToRoot(pCur);
  if (iVar1 == 0x10) {
    *pRes = 1;
  }
  else {
    if (iVar1 != 0) {
      return iVar1;
    }
    *pRes = 0;
    iVar1 = moveToRightmost(pCur);
    if (iVar1 != 0) {
      pCur->curFlags = pCur->curFlags & 0xf7;
      return iVar1;
    }
    pCur->curFlags = pCur->curFlags | 8;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeLast(BtCursor *pCur, int *pRes){
  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );

  /* If the cursor already points to the last entry, this is a no-op. */
  if( CURSOR_VALID==pCur->eState && (pCur->curFlags & BTCF_AtLast)!=0 ){
#ifdef SQLITE_DEBUG
    /* This block serves to assert() that the cursor really does point
    ** to the last entry in the b-tree. */
    int ii;
    for(ii=0; ii<pCur->iPage; ii++){
      assert( pCur->aiIdx[ii]==pCur->apPage[ii]->nCell );
    }
    assert( pCur->ix==pCur->pPage->nCell-1 || CORRUPT_DB );
    testcase( pCur->ix!=pCur->pPage->nCell-1 );
    /* ^-- dbsqlfuzz b92b72e4de80b5140c30ab71372ca719b8feb618 */
    assert( pCur->pPage->leaf );
#endif
    *pRes = 0;
    return SQLITE_OK;
  }
  return btreeLast(pCur, pRes);
}